

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5StorageIndexInsert(Fts5Storage *p,sqlite3_value **apVal,i64 iRowid)

{
  Fts5Config *pConfig_00;
  bool bVar1;
  int nText;
  uchar *pText;
  undefined1 local_50 [8];
  Fts5Buffer buf;
  Fts5InsertCtx ctx;
  int rc;
  Fts5Config *pConfig;
  i64 iRowid_local;
  sqlite3_value **apVal_local;
  Fts5Storage *p_local;
  
  pConfig_00 = p->pConfig;
  ctx.szCol = 0;
  memset(local_50,0,0x10);
  buf._8_8_ = p;
  ctx.szCol = fts5StorageLoadTotals(p,1);
  if (ctx.szCol == 0) {
    ctx.szCol = sqlite3Fts5IndexBeginWrite(p->pIndex,0,iRowid);
  }
  ctx.pStorage._0_4_ = 0;
  while( true ) {
    bVar1 = false;
    if (ctx.szCol == 0) {
      bVar1 = (int)ctx.pStorage < pConfig_00->nCol;
    }
    if (!bVar1) break;
    ctx.pStorage._4_4_ = 0;
    if (pConfig_00->abUnindexed[(int)ctx.pStorage] == '\0') {
      pText = sqlite3_value_text(apVal[(int)ctx.pStorage + 2]);
      nText = sqlite3_value_bytes(apVal[(int)ctx.pStorage + 2]);
      ctx.szCol = sqlite3Fts5Tokenize(pConfig_00,4,(char *)pText,nText,&buf.n,
                                      fts5StorageInsertCallback);
    }
    sqlite3Fts5BufferAppendVarint(&ctx.szCol,(Fts5Buffer *)local_50,(long)ctx.pStorage._4_4_);
    p->aTotalSize[(int)ctx.pStorage] = (long)ctx.pStorage._4_4_ + p->aTotalSize[(int)ctx.pStorage];
    ctx.pStorage._0_4_ = (int)ctx.pStorage + 1;
  }
  p->nTotalRow = p->nTotalRow + 1;
  if (ctx.szCol == 0) {
    ctx.szCol = fts5StorageInsertDocsize(p,iRowid,(Fts5Buffer *)local_50);
  }
  sqlite3_free((void *)local_50);
  return ctx.szCol;
}

Assistant:

static int sqlite3Fts5StorageIndexInsert(
  Fts5Storage *p, 
  sqlite3_value **apVal, 
  i64 iRowid
){
  Fts5Config *pConfig = p->pConfig;
  int rc = SQLITE_OK;             /* Return code */
  Fts5InsertCtx ctx;              /* Tokenization callback context object */
  Fts5Buffer buf;                 /* Buffer used to build up %_docsize blob */

  memset(&buf, 0, sizeof(Fts5Buffer));
  ctx.pStorage = p;
  rc = fts5StorageLoadTotals(p, 1);

  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5IndexBeginWrite(p->pIndex, 0, iRowid);
  }
  for(ctx.iCol=0; rc==SQLITE_OK && ctx.iCol<pConfig->nCol; ctx.iCol++){
    ctx.szCol = 0;
    if( pConfig->abUnindexed[ctx.iCol]==0 ){
      rc = sqlite3Fts5Tokenize(pConfig, 
          FTS5_TOKENIZE_DOCUMENT,
          (const char*)sqlite3_value_text(apVal[ctx.iCol+2]),
          sqlite3_value_bytes(apVal[ctx.iCol+2]),
          (void*)&ctx,
          fts5StorageInsertCallback
      );
    }
    sqlite3Fts5BufferAppendVarint(&rc, &buf, ctx.szCol);
    p->aTotalSize[ctx.iCol] += (i64)ctx.szCol;
  }
  p->nTotalRow++;

  /* Write the %_docsize record */
  if( rc==SQLITE_OK ){
    rc = fts5StorageInsertDocsize(p, iRowid, &buf);
  }
  sqlite3_free(buf.p);

  return rc;
}